

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_DoublesEqualNormalWithText_Test::testBody
          (TEST_TestFailure_DoublesEqualNormalWithText_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  DoublesEqualFailure f;
  TEST_TestFailure_DoublesEqualNormalWithText_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"text");
  DoublesEqualFailure::DoublesEqualFailure
            ((DoublesEqualFailure *)(local_a8 + 0x30),pUVar1,fileName,2,1.0,2.0,3.0,
             (SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"Message: text\n\texpected <1>\n\tbut was  <2> threshold used was <3>",pcVar2,""
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,300,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  DoublesEqualFailure::~DoublesEqualFailure((DoublesEqualFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, DoublesEqualNormalWithText)
{
    DoublesEqualFailure f(test, failFileName, failLineNumber, 1.0, 2.0, 3.0, "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <1>\n"
                  "\tbut was  <2> threshold used was <3>", f);
}